

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# angle_axis_rodrigues.cpp
# Opt level: O3

Matrix3d *
eulerAnglesToRotationMatrix(Matrix3d *__return_storage_ptr__,double roll,double pitch,double yaw)

{
  Matrix3 *res;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  dVar1 = cos(yaw * 0.5);
  dVar2 = sin(yaw * 0.5);
  dVar3 = dVar2 * 0.0;
  dVar4 = cos(pitch * 0.5);
  dVar5 = sin(pitch * 0.5);
  dVar11 = dVar5 * 0.0;
  dVar12 = dVar5 * 1.0;
  dVar5 = dVar5 * 0.0;
  dVar7 = dVar2 * dVar11 - dVar3 * dVar5;
  auVar9._8_4_ = SUB84(dVar7,0);
  auVar9._0_8_ = dVar2 * dVar12 - dVar3 * dVar4;
  auVar9._12_4_ = (int)((ulong)dVar7 >> 0x20);
  dVar8 = SUB168(auVar9 ^ ZEXT816(0x8000000000000000),0) + dVar1 * dVar11 + dVar3 * dVar5;
  dVar10 = SUB168(auVar9 ^ ZEXT816(0x8000000000000000),8) + dVar1 * dVar12 + dVar3 * dVar4;
  dVar7 = -(dVar5 * dVar2 + dVar11 * dVar3) + (dVar1 * dVar4 - dVar12 * dVar3);
  dVar3 = dVar4 * dVar2 + dVar12 * dVar3 + (dVar1 * dVar5 - dVar11 * dVar3);
  dVar1 = cos(roll * 0.5);
  dVar2 = sin(roll * 0.5);
  dVar4 = dVar2 * 1.0;
  dVar11 = dVar2 * 0.0;
  dVar2 = dVar2 * 0.0;
  dVar5 = dVar4 * dVar3 - dVar2 * dVar8;
  auVar6._8_4_ = SUB84(dVar5,0);
  auVar6._0_8_ = dVar11 * dVar3 - dVar1 * dVar8;
  auVar6._12_4_ = (int)((ulong)dVar5 >> 0x20);
  dVar5 = SUB168(auVar6 ^ ZEXT816(0x8000000000000000),0) + dVar10 * dVar2 + dVar4 * dVar7;
  dVar12 = SUB168(auVar6 ^ ZEXT816(0x8000000000000000),8) + dVar10 * dVar1 + dVar11 * dVar7;
  dVar13 = -(dVar8 * dVar4 + dVar3 * dVar2) + (dVar7 * dVar1 - dVar10 * dVar11);
  dVar7 = dVar8 * dVar11 + dVar3 * dVar1 + (dVar7 * dVar2 - dVar10 * dVar4);
  dVar2 = dVar7 + dVar7;
  dVar3 = dVar12 + dVar12;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[1] = dVar5 * dVar3 + dVar2 * dVar13;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[2] = dVar5 * dVar2 - dVar3 * dVar13;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[3] = dVar5 * dVar3 - dVar2 * dVar13;
  dVar1 = dVar5 * dVar5 * 2.0;
  dVar4 = dVar13 * dVar5 * 2.0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[0] = 1.0 - (dVar3 * dVar12 + dVar7 * dVar2);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[4] = 1.0 - (dVar7 * dVar2 + dVar1);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[5] = dVar4 + dVar12 * dVar2;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[6] = dVar5 * dVar2 + dVar3 * dVar13;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[7] = dVar12 * dVar2 - dVar4;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[8] = 1.0 - (dVar1 + dVar3 * dVar12);
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix3d eulerAnglesToRotationMatrix(double roll, double pitch,
                                            double yaw) {
  Eigen::AngleAxisd rollAngle(roll, Eigen::Vector3d::UnitX());
  Eigen::AngleAxisd pitchAngle(pitch, Eigen::Vector3d::UnitY());
  Eigen::AngleAxisd yawAngle(yaw, Eigen::Vector3d::UnitZ());
  Eigen::Quaternion<double> q = yawAngle * pitchAngle * rollAngle;
  Eigen::Matrix3d rotationMatrix = q.matrix();
  return rotationMatrix;
}